

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateBufferReferencedByShaderInterfaceBlockCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourceQueryTestTarget *queryTarget,bool extendedCases)

{
  NodeType NVar1;
  Node *pNVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  ResourceTestCase *pRVar5;
  undefined7 in_register_00000081;
  deInt32 *pdVar6;
  SharedPtr arrayElement;
  SharedPtr structMember;
  SharedPtr variable;
  SharedPtr variableArray;
  SharedPtr variableStruct;
  SharedPtr variableStruct_1;
  SharedPtr local_b8;
  SharedPtr local_a8;
  undefined1 local_98 [8];
  SharedPtrStateBase *pSStack_90;
  MatrixOrder local_88;
  SharedPtr local_78;
  TestNode *local_68;
  Context *local_60;
  SharedPtr local_58;
  SharedPtr local_48;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000081,extendedCases);
  pNVar3 = parentStructure->m_ptr;
  NVar1 = pNVar3->m_type;
  local_68 = &targetGroup->super_TestNode;
  local_60 = context;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = pNVar3;
  pSVar4 = parentStructure->m_state;
  (pNVar2->m_enclosingNode).m_state = pSVar4;
  if (pSVar4 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 1;
  pSStack_90 = (SharedPtrStateBase *)0x0;
  local_98 = (undefined1  [8])pNVar2;
  pSStack_90 = (SharedPtrStateBase *)operator_new(0x20);
  pSStack_90->strongRefCount = 0;
  pSStack_90->weakRefCount = 0;
  pSStack_90->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
  pSStack_90[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSStack_90->strongRefCount = 1;
  pSStack_90->weakRefCount = 1;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
  pNVar3->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar4 = parentStructure->m_state;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  if (pSVar4 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
  local_b8.m_state = (SharedPtrStateBase *)0x0;
  local_b8.m_ptr = pNVar3;
  local_b8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_b8.m_state)->strongRefCount = 0;
  (local_b8.m_state)->weakRefCount = 0;
  (local_b8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
  local_b8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  (local_b8.m_state)->strongRefCount = 1;
  (local_b8.m_state)->weakRefCount = 1;
  pNVar3 = (Node *)operator_new(0x20);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
  pNVar3->m_type = TYPE_STRUCT_MEMBER;
  (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar4 = parentStructure->m_state;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  if (pSVar4 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
  local_a8.m_state = (SharedPtrStateBase *)0x0;
  local_a8.m_ptr = pNVar3;
  local_a8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_a8.m_state)->strongRefCount = 0;
  (local_a8.m_state)->weakRefCount = 0;
  (local_a8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
  local_a8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  (local_a8.m_state)->strongRefCount = 1;
  (local_a8.m_state)->weakRefCount = 1;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = local_b8.m_ptr;
  (pNVar3->m_enclosingNode).m_state = local_b8.m_state;
  if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_b8.m_state)->strongRefCount = (local_b8.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pNVar3;
  local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_78.m_state)->strongRefCount = 0;
  (local_78.m_state)->weakRefCount = 0;
  (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
  local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  (local_78.m_state)->strongRefCount = 1;
  (local_78.m_state)->weakRefCount = 1;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = local_a8.m_ptr;
  (pNVar3->m_enclosingNode).m_state = local_a8.m_state;
  if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_a8.m_state)->strongRefCount = (local_a8.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
  local_58.m_state = (SharedPtrStateBase *)0x0;
  local_58.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_58.m_state = pSVar4;
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase(pRVar5,local_60,(SharedPtr *)local_98,queryTarget,"float");
  tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase(pRVar5,local_60,&local_78,queryTarget,"float_array");
  tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase(pRVar5,local_60,&local_58,queryTarget,"float_struct");
  tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_58.m_ptr = (Node *)0x0;
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar6 = &(local_58.m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_58.m_state = (SharedPtrStateBase *)0x0;
  }
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_78.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar6 = &(local_78.m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_a8.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_a8.m_ptr = (Node *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar6 = &(local_a8.m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_a8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_b8.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_b8.m_ptr = (Node *)0x0;
      (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar6 = &(local_b8.m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_b8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &pSStack_90->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98 = (undefined1  [8])0x0;
      (*pSStack_90->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar6 = &pSStack_90->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      if (pSStack_90 != (SharedPtrStateBase *)0x0) {
        (*pSStack_90->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_90 = (SharedPtrStateBase *)0x0;
    }
  }
  if (NVar1 != TYPE_INTERFACE_BLOCK) {
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_98,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7190;
    pNVar3[1]._vptr_Node = (_func_int **)local_98;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_90;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_88;
    local_b8.m_state = (SharedPtrStateBase *)0x0;
    local_b8.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_b8.m_state = pSVar4;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar2->m_type = TYPE_VARIABLE;
    (pNVar2->m_enclosingNode).m_ptr = pNVar3;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0x28;
    pSStack_90 = (SharedPtrStateBase *)0x0;
    local_98 = (undefined1  [8])pNVar2;
    pSStack_90 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_90->strongRefCount = 0;
    pSStack_90->weakRefCount = 0;
    pSStack_90->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSStack_90[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSStack_90->strongRefCount = 1;
    pSStack_90->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_b8.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_b8.m_state;
    if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_b8.m_state)->strongRefCount = (local_b8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar3;
    local_a8.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_a8.m_state)->strongRefCount = 0;
    (local_a8.m_state)->weakRefCount = 0;
    (local_a8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_a8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    (local_a8.m_state)->strongRefCount = 1;
    (local_a8.m_state)->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x20);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_STRUCT_MEMBER;
    (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = local_a8.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_a8.m_state)->strongRefCount = (local_a8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0x28;
    local_58.m_state = (SharedPtrStateBase *)0x0;
    local_58.m_ptr = pNVar3;
    local_58.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_58.m_state)->strongRefCount = 0;
    (local_58.m_state)->weakRefCount = 0;
    (local_58.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_58.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    (local_58.m_state)->strongRefCount = 1;
    (local_58.m_state)->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0x28;
    local_48.m_state = (SharedPtrStateBase *)0x0;
    local_48.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_48.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,local_60,(SharedPtr *)local_98,queryTarget,"sampler");
    tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,local_60,&local_58,queryTarget,"sampler_array");
    tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,local_60,&local_48,queryTarget,"sampler_struct");
    tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
    pdVar6 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_48.m_ptr = (Node *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar6 = &(local_48.m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      if (local_48.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_48.m_state = (SharedPtrStateBase *)0x0;
    }
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_58.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_58.m_ptr = (Node *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_58.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_58.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_58.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_78.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_78.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_a8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_a8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_a8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (pSStack_90 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_90->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_98 = (undefined1  [8])0x0;
        (*pSStack_90->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &pSStack_90->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (pSStack_90 != (SharedPtrStateBase *)0x0) {
          (*pSStack_90->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_90 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_b8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_b8.m_ptr = (Node *)0x0;
        (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_b8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_b8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_98,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7190;
    pNVar3[1]._vptr_Node = (_func_int **)local_98;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_90;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_88;
    local_b8.m_state = (SharedPtrStateBase *)0x0;
    local_b8.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_b8.m_state = pSVar4;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar2->m_type = TYPE_VARIABLE;
    (pNVar2->m_enclosingNode).m_ptr = pNVar3;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0x54;
    pSStack_90 = (SharedPtrStateBase *)0x0;
    local_98 = (undefined1  [8])pNVar2;
    pSStack_90 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_90->strongRefCount = 0;
    pSStack_90->weakRefCount = 0;
    pSStack_90->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSStack_90[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSStack_90->strongRefCount = 1;
    pSStack_90->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_b8.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_b8.m_state;
    if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_b8.m_state)->strongRefCount = (local_b8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_a8.m_state = pSVar4;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar2->m_type = TYPE_VARIABLE;
    (pNVar2->m_enclosingNode).m_ptr = pNVar3;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0x54;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar2;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_78.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_60,(SharedPtr *)local_98,queryTarget,"atomic_uint");
    tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,local_60,&local_78,queryTarget,"atomic_uint_array");
    tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
    pdVar6 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar6 = &(local_78.m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_a8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_a8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_a8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (pSStack_90 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_90->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_98 = (undefined1  [8])0x0;
        (*pSStack_90->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &pSStack_90->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (pSStack_90 != (SharedPtrStateBase *)0x0) {
          (*pSStack_90->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_90 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_b8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_b8.m_ptr = (Node *)0x0;
        (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_b8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_b8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  if ((char)local_34 != '\0') {
    pNVar3 = (Node *)operator_new(0x20);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_STRUCT_MEMBER;
    (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
    pSStack_90 = (SharedPtrStateBase *)0x0;
    local_98 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_90 = pSVar4;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar2->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar2->m_enclosingNode).m_ptr = pNVar3;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
    local_b8.m_state = (SharedPtrStateBase *)0x0;
    local_b8.m_ptr = pNVar2;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_b8.m_state = pSVar4;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar2;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_a8.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,local_60,&local_a8,queryTarget,"float_array_struct");
    tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
    pdVar6 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_a8.m_ptr = (Node *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar6 = &(local_a8.m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_a8.m_state = (SharedPtrStateBase *)0x0;
    }
    if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_b8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_b8.m_ptr = (Node *)0x0;
        (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_b8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_b8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (pSStack_90 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_90->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_98 = (undefined1  [8])0x0;
        (*pSStack_90->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &pSStack_90->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (pSStack_90 != (SharedPtrStateBase *)0x0) {
          (*pSStack_90->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_90 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    pSStack_90 = (SharedPtrStateBase *)0x0;
    local_98 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_90 = pSVar4;
    pNVar2 = (Node *)operator_new(0x20);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar2->m_type = TYPE_STRUCT_MEMBER;
    (pNVar2->m_enclosingNode).m_ptr = pNVar3;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
    local_b8.m_state = (SharedPtrStateBase *)0x0;
    local_b8.m_ptr = pNVar2;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_b8.m_state = pSVar4;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar2;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_a8.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,local_60,&local_a8,queryTarget,"float_struct_array");
    tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
    pdVar6 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_a8.m_ptr = (Node *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar6 = &(local_a8.m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_a8.m_state = (SharedPtrStateBase *)0x0;
    }
    if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_b8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_b8.m_ptr = (Node *)0x0;
        (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_b8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_b8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (pSStack_90 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_90->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_98 = (undefined1  [8])0x0;
        (*pSStack_90->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &pSStack_90->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (pSStack_90 != (SharedPtrStateBase *)0x0) {
          (*pSStack_90->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_90 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    pSStack_90 = (SharedPtrStateBase *)0x0;
    local_98 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_90 = pSVar4;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar2->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar2->m_enclosingNode).m_ptr = pNVar3;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
    local_b8.m_state = (SharedPtrStateBase *)0x0;
    local_b8.m_ptr = pNVar2;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_b8.m_state = pSVar4;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar2;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_a8.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,local_60,&local_a8,queryTarget,"float_array_array");
    tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
    pdVar6 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_a8.m_ptr = (Node *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar6 = &(local_a8.m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_a8.m_state = (SharedPtrStateBase *)0x0;
    }
    if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_b8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_b8.m_ptr = (Node *)0x0;
        (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_b8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_b8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (pSStack_90 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_90->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_98 = (undefined1  [8])0x0;
        (*pSStack_90->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &pSStack_90->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (pSStack_90 != (SharedPtrStateBase *)0x0) {
          (*pSStack_90->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_90 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x20);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_STRUCT_MEMBER;
    (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
    pSStack_90 = (SharedPtrStateBase *)0x0;
    local_98 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_90 = pSVar4;
    pNVar2 = (Node *)operator_new(0x20);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar2->m_type = TYPE_STRUCT_MEMBER;
    (pNVar2->m_enclosingNode).m_ptr = pNVar3;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
    local_b8.m_state = (SharedPtrStateBase *)0x0;
    local_b8.m_ptr = pNVar2;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_b8.m_state = pSVar4;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar2;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_a8.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,local_60,&local_a8,queryTarget,"float_struct_struct");
    tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
    pdVar6 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_a8.m_ptr = (Node *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar6 = &(local_a8.m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_a8.m_state = (SharedPtrStateBase *)0x0;
    }
    if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_b8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_b8.m_ptr = (Node *)0x0;
        (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_b8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_b8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (pSStack_90 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_90->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_98 = (undefined1  [8])0x0;
        (*pSStack_90->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &pSStack_90->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (pSStack_90 != (SharedPtrStateBase *)0x0) {
          (*pSStack_90->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_90 = (SharedPtrStateBase *)0x0;
      }
    }
    if (queryTarget->interface == PROGRAMINTERFACE_BUFFER_VARIABLE) {
      pNVar3 = (Node *)operator_new(0x28);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar3->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
      pSVar4 = parentStructure->m_state;
      (pNVar3->m_enclosingNode).m_state = pSVar4;
      if (pSVar4 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar6 = *pdVar6 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
      *(undefined4 *)&pNVar3[1]._vptr_Node = 0xfffffffe;
      pSStack_90 = (SharedPtrStateBase *)0x0;
      local_98 = (undefined1  [8])pNVar3;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      pSStack_90 = pSVar4;
      pNVar2 = (Node *)operator_new(0x28);
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar2->m_type = TYPE_VARIABLE;
      (pNVar2->m_enclosingNode).m_ptr = pNVar3;
      (pNVar2->m_enclosingNode).m_state = pSVar4;
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
      *(undefined4 *)&pNVar2[1]._vptr_Node = 1;
      local_b8.m_state = (SharedPtrStateBase *)0x0;
      local_b8.m_ptr = pNVar2;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      local_b8.m_state = pSVar4;
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (pRVar5,local_60,&local_b8,queryTarget,"float_unsized_array");
      tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
      pdVar6 = &pSVar4->strongRefCount;
      LOCK();
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_b8.m_ptr = (Node *)0x0;
        (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_b8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_b8.m_state = (SharedPtrStateBase *)0x0;
      }
      pNVar3 = (Node *)operator_new(0x20);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar3->m_type = TYPE_STRUCT_MEMBER;
      (pNVar3->m_enclosingNode).m_ptr = (Node *)local_98;
      (pNVar3->m_enclosingNode).m_state = pSStack_90;
      if (pSStack_90 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_90->strongRefCount = pSStack_90->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar6 = *pdVar6 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
      local_b8.m_state = (SharedPtrStateBase *)0x0;
      local_b8.m_ptr = pNVar3;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      local_b8.m_state = pSVar4;
      pNVar2 = (Node *)operator_new(0x28);
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar2->m_type = TYPE_VARIABLE;
      (pNVar2->m_enclosingNode).m_ptr = pNVar3;
      (pNVar2->m_enclosingNode).m_state = pSVar4;
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
      *(undefined4 *)&pNVar2[1]._vptr_Node = 1;
      local_a8.m_state = (SharedPtrStateBase *)0x0;
      local_a8.m_ptr = pNVar2;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      local_a8.m_state = pSVar4;
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (pRVar5,local_60,&local_a8,queryTarget,"float_unsized_struct_array");
      tcu::TestNode::addChild(local_68,(TestNode *)pRVar5);
      pdVar6 = &pSVar4->strongRefCount;
      LOCK();
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_a8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_a8.m_state = (SharedPtrStateBase *)0x0;
      }
      if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar6 = &(local_b8.m_state)->strongRefCount;
        *pdVar6 = *pdVar6 + -1;
        UNLOCK();
        if (*pdVar6 == 0) {
          local_b8.m_ptr = (Node *)0x0;
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar6 = &(local_b8.m_state)->weakRefCount;
        *pdVar6 = *pdVar6 + -1;
        UNLOCK();
        if (*pdVar6 == 0) {
          if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_b8.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      if (pSStack_90 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar6 = &pSStack_90->strongRefCount;
        *pdVar6 = *pdVar6 + -1;
        UNLOCK();
        if (*pdVar6 == 0) {
          local_98 = (undefined1  [8])0x0;
          (*pSStack_90->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar6 = &pSStack_90->weakRefCount;
        *pdVar6 = *pdVar6 + -1;
        UNLOCK();
        if ((*pdVar6 == 0) && (pSStack_90 != (SharedPtrStateBase *)0x0)) {
          (*pSStack_90->_vptr_SharedPtrStateBase[1])();
        }
      }
    }
  }
  return;
}

Assistant:

static void generateBufferReferencedByShaderInterfaceBlockCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const ProgramResourceQueryTestTarget& queryTarget, bool extendedCases)
{
	const bool isDefaultBlock = (parentStructure->getType() != ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);

	// .float
	// .float_array
	// .float_struct
	{
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(parentStructure, glu::TYPE_FLOAT));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(parentStructure));
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));
		const ResourceDefinition::Node::SharedPtr	variableStruct	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "float"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_array"));
		targetGroup->addChild(new ResourceTestCase(context, variableStruct, queryTarget, "float_struct"));
	}

	// .sampler
	// .sampler_array
	// .sampler_struct
	if (isDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr	layout			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(layout, glu::TYPE_SAMPLER_2D));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(layout));
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_SAMPLER_2D));
		const ResourceDefinition::Node::SharedPtr	variableStruct	(new ResourceDefinition::Variable(structMember, glu::TYPE_SAMPLER_2D));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "sampler"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "sampler_array"));
		targetGroup->addChild(new ResourceTestCase(context, variableStruct, queryTarget, "sampler_struct"));
	}

	// .atomic_uint
	// .atomic_uint_array
	if (isDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr	layout			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(layout, glu::TYPE_UINT_ATOMIC_COUNTER));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(layout));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "atomic_uint"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "atomic_uint_array"));
	}

	if (extendedCases)
	{
		// .float_array_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMember		(new ResourceDefinition::StructMember(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(structMember));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_array_struct"));
		}

		// .float_struct_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayStructMember	(new ResourceDefinition::StructMember(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(arrayStructMember, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_struct_array"));
		}

		// .float_array_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	subArrayElement		(new ResourceDefinition::ArrayElement(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(subArrayElement, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_array_array"));
		}

		// .float_struct_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMember		(new ResourceDefinition::StructMember(parentStructure));
			const ResourceDefinition::Node::SharedPtr	subStructMember		(new ResourceDefinition::StructMember(structMember));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(subStructMember, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_struct_struct"));
		}

		if (queryTarget.interface == PROGRAMINTERFACE_BUFFER_VARIABLE)
		{
			const ResourceDefinition::Node::SharedPtr arrayElement(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));

			// .float_unsized_array
			{
				const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_unsized_array"));
			}

			// .float_unsized_struct_array
			{
				const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(arrayElement));
				const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));

				targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_unsized_struct_array"));
			}
		}
	}
}